

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc.c
# Opt level: O0

int ipc_ep_init_listener(void *arg,nng_url *url,nni_listener *listener)

{
  nni_sock *sock_00;
  nni_sock *sock;
  int rv;
  ipc_ep *ep;
  nni_listener *listener_local;
  nng_url *url_local;
  void *arg_local;
  
  sock_00 = nni_listener_sock(listener);
  ipc_ep_init((ipc_ep *)arg,sock_00,ipc_ep_accept_cb);
  *(nni_listener **)((long)arg + 0x48) = listener;
  arg_local._4_4_ = nng_stream_listener_alloc_url((nng_stream_listener **)((long)arg + 0x40),url);
  if (arg_local._4_4_ == 0) {
    nni_listener_add_stat(listener,(nni_stat_item *)((long)arg + 0x420));
    arg_local._4_4_ = 0;
  }
  return arg_local._4_4_;
}

Assistant:

static int
ipc_ep_init_listener(void *arg, nng_url *url, nni_listener *listener)
{
	ipc_ep   *ep = arg;
	int       rv;
	nni_sock *sock = nni_listener_sock(listener);

	ipc_ep_init(ep, sock, ipc_ep_accept_cb);
	ep->nlistener = listener;

	if ((rv = nng_stream_listener_alloc_url(&ep->listener, url)) != 0) {
		return (rv);
	}

#ifdef NNG_ENABLE_STATS
	nni_listener_add_stat(listener, &ep->st_rcv_max);
#endif
	return (0);
}